

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileConnections.hpp
# Opt level: O2

void helics::fileops::makeConnectionsToml<helics::CommonCore>(CommonCore *brk,string *file)

{
  CommonCore *pCVar1;
  value *pvVar2;
  pointer pcVar3;
  size_type sVar4;
  pointer pbVar5;
  _Hash_node_base _Var6;
  _Hash_node_base *p_Var7;
  enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> *peVar8;
  array_type *paVar9;
  string_type *psVar10;
  table_type *ptVar11;
  CommonCore *pCVar12;
  string *psVar13;
  char *in_R9;
  basic_value<toml::type_config> *val;
  pointer pbVar14;
  __node_base *p_Var15;
  string_view source;
  string_view source_00;
  string_view filter;
  string_view interfaceKey;
  string_view interfaceKey_00;
  string_view defVal;
  string_view defVal_00;
  string_view defVal_01;
  string_view defVal_02;
  string_view defVal_03;
  string_view defVal_04;
  string_view defVal_05;
  string_view target;
  anon_class_16_2_4418202b callback;
  anon_class_16_2_4418055b callback_00;
  anon_class_16_2_4418055b callback_01;
  anon_class_16_2_4417f657 callback_02;
  anon_class_16_2_4417f657 callback_03;
  string_view dest;
  anon_class_16_2_4418202b callback_04;
  anon_class_16_2_4418055b callback_05;
  anon_class_16_2_4418055b callback_06;
  anon_class_16_2_4417f657 callback_07;
  anon_class_16_2_4417f657 callback_08;
  string_view endpoint;
  anon_class_16_2_d8a696df callback_09;
  anon_class_16_2_d8a696df callback_10;
  anon_class_16_2_d8a696df callback_11;
  anon_class_16_2_d8a696df callback_12;
  anon_class_16_2_d8a696df callback_13;
  string_view alias;
  string_view alias_00;
  allocator<char> local_7d1;
  pointer local_7d0;
  undefined1 local_7c8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_7a8;
  undefined1 local_798 [16];
  enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> aliases;
  enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> globals;
  undefined1 local_5f8 [64];
  undefined1 local_5b8 [32];
  enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> filts;
  undefined1 local_4d0 [64];
  undefined1 local_490 [64];
  undefined1 local_450 [64];
  undefined1 local_410 [64];
  undefined1 local_3d0 [64];
  undefined1 local_390 [64];
  enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> lnks;
  enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> conns;
  value doc;
  value uVal;
  
  toml::basic_value<toml::type_config>::basic_value(&uVal);
  toml::basic_value<toml::type_config>::basic_value(&doc);
  loadToml(&conns,file);
  toml::basic_value<toml::type_config>::operator=(&doc,&conns);
  toml::basic_value<toml::type_config>::~basic_value(&conns);
  peVar8 = toml::find_or<toml::type_config,char[12]>(&doc,(char (*) [12])0x37485c,&uVal);
  toml::basic_value<toml::type_config>::basic_value(&conns,peVar8);
  if (conns.type_ != empty) {
    paVar9 = toml::basic_value<toml::type_config>::as_array(&conns);
    pbVar14 = (paVar9->
              super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    local_7d0 = (paVar9->
                super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
    while( true ) {
      pCVar12 = (CommonCore *)&globals;
      if (pbVar14 == local_7d0) break;
      if (pbVar14->type_ == array) {
        paVar9 = toml::basic_value<toml::type_config>::as_array(pbVar14);
        psVar10 = toml::basic_value<toml::type_config>::as_string_abi_cxx11_
                            ((paVar9->
                             super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                             )._M_impl.super__Vector_impl_data._M_start);
        pcVar3 = (psVar10->_M_dataplus)._M_p;
        sVar4 = psVar10->_M_string_length;
        psVar10 = toml::basic_value<toml::type_config>::as_string_abi_cxx11_
                            ((paVar9->
                             super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                             )._M_impl.super__Vector_impl_data._M_start + 1);
        source._M_str = pcVar3;
        source._M_len = sVar4;
        target._M_str = (psVar10->_M_dataplus)._M_p;
        target._M_len = psVar10->_M_string_length;
        CommonCore::dataLink(brk,source,target);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&filts,"publication",(allocator<char> *)&aliases);
        psVar13 = (string *)((long)&globals.field_1 + 8);
        globals.field_1.integer_.value = 0;
        globals.field_1.integer_.format.fmt = dec;
        defVal._M_str = in_R9;
        defVal._M_len = (size_t)psVar13;
        globals._0_8_ = psVar13;
        getOrDefault((string *)&lnks,(fileops *)pbVar14,(value *)&filts,(string *)0x0,defVal);
        std::__cxx11::string::~string((string *)pCVar12);
        std::__cxx11::string::~string((string *)&filts);
        if (lnks.field_1.integer_.value == 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)pCVar12,"input",(allocator<char> *)local_7c8);
          psVar13 = (string *)((long)&aliases.field_1 + 8);
          aliases.field_1.integer_.value = 0;
          aliases.field_1.integer_.format.fmt = dec;
          defVal_00._M_str = in_R9;
          defVal_00._M_len = (size_t)psVar13;
          aliases._0_8_ = psVar13;
          getOrDefault((string *)&filts,(fileops *)pbVar14,(value *)pCVar12,(string *)0x0,defVal_00)
          ;
          std::__cxx11::string::~string((string *)&aliases);
          std::__cxx11::string::~string((string *)pCVar12);
          if (filts.field_1.integer_.value == 0) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&aliases,"endpoint",(allocator<char> *)local_7a8._M_local_buf);
            psVar13 = (string *)(local_7c8 + 0x10);
            local_7c8._8_8_ = 0;
            local_7c8[0x10] = dec;
            defVal_01._M_str = in_R9;
            defVal_01._M_len = (size_t)psVar13;
            local_7c8._0_8_ = psVar13;
            getOrDefault((string *)pCVar12,(fileops *)pbVar14,&aliases,(string *)0x0,defVal_01);
            std::__cxx11::string::~string((string *)local_7c8);
            std::__cxx11::string::~string((string *)&aliases);
            if (globals.field_1.integer_.value != 0) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_5b8,"targets",(allocator<char> *)&aliases);
              callback_02.ept = psVar13;
              callback_02.brk = pCVar12;
              addTargets<helics::fileops::makeConnectionsToml<helics::CommonCore>(helics::CommonCore*,std::__cxx11::string_const&)::_lambda(std::__cxx11::string_const&)_4_>
                        ((helics *)pbVar14,(value *)local_5b8,(string *)brk,callback_02);
              std::__cxx11::string::~string((string *)local_5b8);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_3d0,"sources",(allocator<char> *)&aliases);
              callback_03.ept = psVar13;
              callback_03.brk = pCVar12;
              addTargets<helics::fileops::makeConnectionsToml<helics::CommonCore>(helics::CommonCore*,std::__cxx11::string_const&)::_lambda(std::__cxx11::string_const&)_5_>
                        ((helics *)pbVar14,(value *)local_3d0,(string *)brk,callback_03);
              std::__cxx11::string::~string((string *)local_3d0);
            }
          }
          else {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_390,"targets",(allocator<char> *)pCVar12);
            callback_00.ipt = psVar13;
            callback_00.brk = (CommonCore *)&filts;
            addTargets<helics::fileops::makeConnectionsToml<helics::CommonCore>(helics::CommonCore*,std::__cxx11::string_const&)::_lambda(std::__cxx11::string_const&)_2_>
                      ((helics *)pbVar14,(value *)local_390,(string *)brk,callback_00);
            std::__cxx11::string::~string((string *)local_390);
            pCVar1 = (CommonCore *)(local_3d0 + 0x20);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)pCVar1,"sources",(allocator<char> *)pCVar12);
            callback_01.ipt = psVar13;
            callback_01.brk = (CommonCore *)&filts;
            addTargets<helics::fileops::makeConnectionsToml<helics::CommonCore>(helics::CommonCore*,std::__cxx11::string_const&)::_lambda(std::__cxx11::string_const&)_3_>
                      ((helics *)pbVar14,(value *)pCVar1,(string *)brk,callback_01);
            pCVar12 = pCVar1;
          }
          std::__cxx11::string::~string((string *)pCVar12);
          pCVar12 = (CommonCore *)&filts;
        }
        else {
          pCVar12 = (CommonCore *)(local_390 + 0x20);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)pCVar12,"targets",(allocator<char> *)&filts);
          callback.pub = psVar13;
          callback.brk = (CommonCore *)&lnks;
          addTargets<helics::fileops::makeConnectionsToml<helics::CommonCore>(helics::CommonCore*,std::__cxx11::string_const&)::_lambda(std::__cxx11::string_const&)_1_>
                    ((helics *)pbVar14,(value *)pCVar12,(string *)brk,callback);
        }
        std::__cxx11::string::~string((string *)pCVar12);
        std::__cxx11::string::~string((string *)&lnks);
      }
      pbVar14 = pbVar14 + 1;
    }
  }
  peVar8 = toml::find_or<toml::type_config,char[6]>(&doc,(char (*) [6])"links",&uVal);
  toml::basic_value<toml::type_config>::basic_value(&lnks,peVar8);
  if (lnks.type_ != empty) {
    paVar9 = toml::basic_value<toml::type_config>::as_array(&lnks);
    pbVar14 = (paVar9->
              super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    local_7d0 = (paVar9->
                super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
    while( true ) {
      pCVar12 = (CommonCore *)&aliases;
      pvVar2 = (value *)(local_5f8 + 0x20);
      if (pbVar14 == local_7d0) break;
      if (pbVar14->type_ == array) {
        paVar9 = toml::basic_value<toml::type_config>::as_array(pbVar14);
        psVar10 = toml::basic_value<toml::type_config>::as_string_abi_cxx11_
                            ((paVar9->
                             super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                             )._M_impl.super__Vector_impl_data._M_start);
        pcVar3 = (psVar10->_M_dataplus)._M_p;
        sVar4 = psVar10->_M_string_length;
        psVar10 = toml::basic_value<toml::type_config>::as_string_abi_cxx11_
                            ((paVar9->
                             super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                             )._M_impl.super__Vector_impl_data._M_start + 1);
        source_00._M_str = pcVar3;
        source_00._M_len = sVar4;
        dest._M_str = (psVar10->_M_dataplus)._M_p;
        dest._M_len = psVar10->_M_string_length;
        CommonCore::linkEndpoints(brk,source_00,dest);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&globals,"publication",(allocator<char> *)local_7c8);
        psVar13 = (string *)((long)&aliases.field_1 + 8);
        aliases.field_1.integer_.value = 0;
        aliases.field_1.integer_.format.fmt = dec;
        defVal_02._M_str = in_R9;
        defVal_02._M_len = (size_t)psVar13;
        aliases._0_8_ = psVar13;
        getOrDefault((string *)&filts,(fileops *)pbVar14,(value *)&globals,(string *)0x0,defVal_02);
        std::__cxx11::string::~string((string *)pCVar12);
        std::__cxx11::string::~string((string *)&globals);
        if (filts.field_1.integer_.value == 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)pCVar12,"input",(allocator<char> *)local_7a8._M_local_buf);
          psVar13 = (string *)(local_7c8 + 0x10);
          local_7c8._8_8_ = 0;
          local_7c8[0x10] = dec;
          defVal_03._M_str = in_R9;
          defVal_03._M_len = (size_t)psVar13;
          local_7c8._0_8_ = psVar13;
          getOrDefault((string *)&globals,(fileops *)pbVar14,(value *)pCVar12,(string *)0x0,
                       defVal_03);
          std::__cxx11::string::~string((string *)local_7c8);
          std::__cxx11::string::~string((string *)pCVar12);
          if (globals.field_1.integer_.value == 0) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_7c8,"endpoint",&local_7d1);
            psVar13 = (string *)local_798;
            local_7a8._8_8_ = 0;
            local_798[0] = 0;
            defVal_04._M_str = in_R9;
            defVal_04._M_len = (size_t)psVar13;
            local_7a8._M_allocated_capacity = (size_type)psVar13;
            getOrDefault((string *)pCVar12,(fileops *)pbVar14,(value *)local_7c8,(string *)0x0,
                         defVal_04);
            std::__cxx11::string::~string((string *)local_7a8._M_local_buf);
            std::__cxx11::string::~string((string *)local_7c8);
            if (aliases.field_1.integer_.value != 0) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)pvVar2,"targets",(allocator<char> *)local_7c8);
              callback_07.ept = psVar13;
              callback_07.brk = pCVar12;
              addTargets<helics::fileops::makeConnectionsToml<helics::CommonCore>(helics::CommonCore*,std::__cxx11::string_const&)::_lambda(std::__cxx11::string_const&)_9_>
                        ((helics *)pbVar14,pvVar2,(string *)brk,callback_07);
              std::__cxx11::string::~string((string *)pvVar2);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_450,"sources",(allocator<char> *)local_7c8);
              callback_08.ept = psVar13;
              callback_08.brk = pCVar12;
              addTargets<helics::fileops::makeConnectionsToml<helics::CommonCore>(helics::CommonCore*,std::__cxx11::string_const&)::_lambda(std::__cxx11::string_const&)_10_>
                        ((helics *)pbVar14,(value *)local_450,(string *)brk,callback_08);
              std::__cxx11::string::~string((string *)local_450);
            }
          }
          else {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_410,"targets",(allocator<char> *)pCVar12);
            callback_05.ipt = psVar13;
            callback_05.brk = (CommonCore *)&globals;
            addTargets<helics::fileops::makeConnectionsToml<helics::CommonCore>(helics::CommonCore*,std::__cxx11::string_const&)::_lambda(std::__cxx11::string_const&)_7_>
                      ((helics *)pbVar14,(value *)local_410,(string *)brk,callback_05);
            std::__cxx11::string::~string((string *)local_410);
            pCVar1 = (CommonCore *)(local_450 + 0x20);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)pCVar1,"sources",(allocator<char> *)pCVar12);
            callback_06.ipt = psVar13;
            callback_06.brk = (CommonCore *)&globals;
            addTargets<helics::fileops::makeConnectionsToml<helics::CommonCore>(helics::CommonCore*,std::__cxx11::string_const&)::_lambda(std::__cxx11::string_const&)_8_>
                      ((helics *)pbVar14,(value *)pCVar1,(string *)brk,callback_06);
            pCVar12 = pCVar1;
          }
          std::__cxx11::string::~string((string *)pCVar12);
          pCVar12 = (CommonCore *)&globals;
        }
        else {
          pCVar12 = (CommonCore *)(local_410 + 0x20);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)pCVar12,"targets",(allocator<char> *)&globals);
          callback_04.pub = psVar13;
          callback_04.brk = (CommonCore *)&filts;
          addTargets<helics::fileops::makeConnectionsToml<helics::CommonCore>(helics::CommonCore*,std::__cxx11::string_const&)::_lambda(std::__cxx11::string_const&)_6_>
                    ((helics *)pbVar14,(value *)pCVar12,(string *)brk,callback_04);
        }
        std::__cxx11::string::~string((string *)pCVar12);
        std::__cxx11::string::~string((string *)&filts);
      }
      pbVar14 = pbVar14 + 1;
    }
  }
  peVar8 = toml::find_or<toml::type_config,char[8]>(&doc,(char (*) [8])0x37a35e,&uVal);
  toml::basic_value<toml::type_config>::basic_value(&filts,peVar8);
  if (filts.type_ != empty) {
    paVar9 = toml::basic_value<toml::type_config>::as_array(&filts);
    pbVar14 = (paVar9->
              super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    local_7d0 = (paVar9->
                super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
    while( true ) {
      if (pbVar14 == local_7d0) break;
      if (pbVar14->type_ == array) {
        paVar9 = toml::basic_value<toml::type_config>::as_array(pbVar14);
        psVar10 = toml::basic_value<toml::type_config>::as_string_abi_cxx11_
                            ((paVar9->
                             super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                             )._M_impl.super__Vector_impl_data._M_start);
        pcVar3 = (psVar10->_M_dataplus)._M_p;
        sVar4 = psVar10->_M_string_length;
        psVar10 = toml::basic_value<toml::type_config>::as_string_abi_cxx11_
                            ((paVar9->
                             super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                             )._M_impl.super__Vector_impl_data._M_start + 1);
        filter._M_str = pcVar3;
        filter._M_len = sVar4;
        endpoint._M_str = (psVar10->_M_dataplus)._M_p;
        endpoint._M_len = psVar10->_M_string_length;
        CommonCore::addSourceFilterToEndpoint(brk,filter,endpoint);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&aliases,"filter",(allocator<char> *)local_7a8._M_local_buf);
        psVar13 = (string *)(local_7c8 + 0x10);
        local_7c8._8_8_ = 0;
        local_7c8[0x10] = dec;
        defVal_05._M_str = in_R9;
        defVal_05._M_len = (size_t)psVar13;
        local_7c8._0_8_ = psVar13;
        getOrDefault((string *)&globals,(fileops *)pbVar14,&aliases,(string *)0x0,defVal_05);
        std::__cxx11::string::~string((string *)local_7c8);
        std::__cxx11::string::~string((string *)&aliases);
        if (globals.field_1.integer_.value != 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_5f8,"endpoints",(allocator<char> *)&aliases);
          callback_09.fname = psVar13;
          callback_09.brk = (CommonCore *)&globals;
          addTargets<helics::fileops::makeConnectionsToml<helics::CommonCore>(helics::CommonCore*,std::__cxx11::string_const&)::_lambda(std::__cxx11::string_const&)_11_>
                    ((helics *)pbVar14,(value *)local_5f8,(string *)brk,callback_09);
          pvVar2 = (value *)(local_490 + 0x20);
          std::__cxx11::string::~string((string *)local_5f8);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)pvVar2,"source_endpoints",(allocator<char> *)&aliases);
          callback_10.fname = psVar13;
          callback_10.brk = (CommonCore *)&globals;
          addTargets<helics::fileops::makeConnectionsToml<helics::CommonCore>(helics::CommonCore*,std::__cxx11::string_const&)::_lambda(std::__cxx11::string_const&)_11_>
                    ((helics *)pbVar14,pvVar2,(string *)brk,callback_10);
          std::__cxx11::string::~string((string *)pvVar2);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_490,"sourceEndpoints",(allocator<char> *)&aliases);
          callback_11.fname = psVar13;
          callback_11.brk = (CommonCore *)&globals;
          addTargets<helics::fileops::makeConnectionsToml<helics::CommonCore>(helics::CommonCore*,std::__cxx11::string_const&)::_lambda(std::__cxx11::string_const&)_11_>
                    ((helics *)pbVar14,(value *)local_490,(string *)brk,callback_11);
          pvVar2 = (value *)(local_4d0 + 0x20);
          std::__cxx11::string::~string((string *)local_490);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)pvVar2,"dest_endpoints",(allocator<char> *)&aliases);
          callback_12.fname = psVar13;
          callback_12.brk = (CommonCore *)&globals;
          addTargets<helics::fileops::makeConnectionsToml<helics::CommonCore>(helics::CommonCore*,std::__cxx11::string_const&)::_lambda(std::__cxx11::string_const&)_12_>
                    ((helics *)pbVar14,pvVar2,(string *)brk,callback_12);
          std::__cxx11::string::~string((string *)pvVar2);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_4d0,"destEndpoints",(allocator<char> *)&aliases);
          callback_13.fname = psVar13;
          callback_13.brk = (CommonCore *)&globals;
          addTargets<helics::fileops::makeConnectionsToml<helics::CommonCore>(helics::CommonCore*,std::__cxx11::string_const&)::_lambda(std::__cxx11::string_const&)_12_>
                    ((helics *)pbVar14,(value *)local_4d0,(string *)brk,callback_13);
          std::__cxx11::string::~string((string *)local_4d0);
        }
        std::__cxx11::string::~string((string *)&globals);
      }
      pbVar14 = pbVar14 + 1;
    }
  }
  peVar8 = toml::find_or<toml::type_config,char[8]>(&doc,(char (*) [8])"globals",&uVal);
  toml::basic_value<toml::type_config>::basic_value(&globals,peVar8);
  if (globals.type_ != empty) {
    if (globals.type_ == array) {
      paVar9 = toml::basic_value<toml::type_config>::as_array(&globals);
      pbVar5 = (paVar9->
               super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar14 = (paVar9->
                     super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                     )._M_impl.super__Vector_impl_data._M_start; pbVar14 != pbVar5;
          pbVar14 = pbVar14 + 1) {
        paVar9 = toml::basic_value<toml::type_config>::as_array(pbVar14);
        psVar10 = toml::basic_value<toml::type_config>::as_string_abi_cxx11_
                            ((paVar9->
                             super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                             )._M_impl.super__Vector_impl_data._M_start);
        pcVar3 = (psVar10->_M_dataplus)._M_p;
        sVar4 = psVar10->_M_string_length;
        paVar9 = toml::basic_value<toml::type_config>::as_array(pbVar14);
        psVar10 = toml::basic_value<toml::type_config>::as_string_abi_cxx11_
                            ((paVar9->
                             super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                             )._M_impl.super__Vector_impl_data._M_start + 1);
        (*(brk->super_Core)._vptr_Core[0x5a])
                  (brk,sVar4,pcVar3,psVar10->_M_string_length,(psVar10->_M_dataplus)._M_p);
      }
    }
    else {
      ptVar11 = toml::basic_value<toml::type_config>::as_table_abi_cxx11_(&globals);
      p_Var15 = &(ptVar11->_M_h)._M_before_begin;
      while (p_Var15 = p_Var15->_M_nxt, p_Var15 != (__node_base *)0x0) {
        _Var6._M_nxt = p_Var15[1]._M_nxt;
        p_Var7 = *(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var15 + 2))->_M_max_load_factor;
        psVar10 = toml::basic_value<toml::type_config>::as_string_abi_cxx11_
                            ((basic_value<toml::type_config> *)(p_Var15 + 5));
        (*(brk->super_Core)._vptr_Core[0x5a])
                  (brk,p_Var7,_Var6._M_nxt,psVar10->_M_string_length,(psVar10->_M_dataplus)._M_p);
      }
    }
  }
  peVar8 = toml::find_or<toml::type_config,char[8]>(&doc,(char (*) [8])"aliases",&uVal);
  toml::basic_value<toml::type_config>::basic_value(&aliases,peVar8);
  if (aliases.type_ != empty) {
    if (aliases.type_ == array) {
      paVar9 = toml::basic_value<toml::type_config>::as_array(&aliases);
      pbVar5 = (paVar9->
               super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar14 = (paVar9->
                     super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                     )._M_impl.super__Vector_impl_data._M_start; pbVar14 != pbVar5;
          pbVar14 = pbVar14 + 1) {
        paVar9 = toml::basic_value<toml::type_config>::as_array(pbVar14);
        psVar10 = toml::basic_value<toml::type_config>::as_string_abi_cxx11_
                            ((paVar9->
                             super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                             )._M_impl.super__Vector_impl_data._M_start);
        pcVar3 = (psVar10->_M_dataplus)._M_p;
        sVar4 = psVar10->_M_string_length;
        paVar9 = toml::basic_value<toml::type_config>::as_array(pbVar14);
        psVar10 = toml::basic_value<toml::type_config>::as_string_abi_cxx11_
                            ((paVar9->
                             super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                             )._M_impl.super__Vector_impl_data._M_start + 1);
        interfaceKey._M_str = pcVar3;
        interfaceKey._M_len = sVar4;
        alias._M_str = (psVar10->_M_dataplus)._M_p;
        alias._M_len = psVar10->_M_string_length;
        CommonCore::addAlias(brk,interfaceKey,alias);
      }
    }
    else {
      ptVar11 = toml::basic_value<toml::type_config>::as_table_abi_cxx11_(&aliases);
      p_Var15 = &(ptVar11->_M_h)._M_before_begin;
      while (p_Var15 = p_Var15->_M_nxt, p_Var15 != (__node_base *)0x0) {
        _Var6._M_nxt = p_Var15[1]._M_nxt;
        p_Var7 = *(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var15 + 2))->_M_max_load_factor;
        psVar10 = toml::basic_value<toml::type_config>::as_string_abi_cxx11_
                            ((basic_value<toml::type_config> *)(p_Var15 + 5));
        interfaceKey_00._M_str = (char *)_Var6._M_nxt;
        interfaceKey_00._M_len = (size_t)p_Var7;
        alias_00._M_str = (psVar10->_M_dataplus)._M_p;
        alias_00._M_len = psVar10->_M_string_length;
        CommonCore::addAlias(brk,interfaceKey_00,alias_00);
      }
    }
  }
  toml::basic_value<toml::type_config>::~basic_value(&aliases);
  toml::basic_value<toml::type_config>::~basic_value(&globals);
  toml::basic_value<toml::type_config>::~basic_value(&filts);
  toml::basic_value<toml::type_config>::~basic_value(&lnks);
  toml::basic_value<toml::type_config>::~basic_value(&conns);
  toml::basic_value<toml::type_config>::~basic_value(&doc);
  toml::basic_value<toml::type_config>::~basic_value(&uVal);
  return;
}

Assistant:

void makeConnectionsToml(brkX* brk, const std::string& file)
{
    toml::value uVal;
    static_assert(std::is_base_of<Broker, brkX>::value || std::is_base_of<Core, brkX>::value,
                  "broker must be Core or broker");
    toml::value doc;
    try {
        doc = loadToml(file);
    }
    catch (const std::invalid_argument& ia) {
        throw(helics::InvalidParameter(ia.what()));
    }

    auto conns = toml::find_or(doc, "connections", uVal);
    if (!conns.is_empty()) {
        auto& connArray = conns.as_array();
        for (const auto& conn : connArray) {
            if (conn.is_array()) {
                auto& connAct = conn.as_array();
                brk->dataLink(connAct[0].as_string(), connAct[1].as_string());
            } else {
                std::string pub = getOrDefault(conn, "publication", std::string());
                if (!pub.empty()) {
                    addTargets(conn, "targets", [brk, &pub](const std::string& target) {
                        brk->dataLink(pub, target);
                    });
                } else {
                    std::string ipt = getOrDefault(conn, "input", std::string());
                    if (!ipt.empty()) {
                        addTargets(conn, "targets", [brk, &ipt](const std::string& target) {
                            brk->dataLink(target, ipt);
                        });
                        addTargets(conn, "sources", [brk, &ipt](const std::string& source) {
                            brk->dataLink(source, ipt);
                        });
                    } else {
                        std::string ept = getOrDefault(conn, "endpoint", std::string());
                        if (!ept.empty()) {
                            addTargets(conn, "targets", [brk, &ept](const std::string& target) {
                                brk->linkEndpoints(ept, target);
                            });
                            addTargets(conn, "sources", [brk, &ept](const std::string& source) {
                                brk->linkEndpoints(source, ept);
                            });
                        }
                    }
                }
            }
        }
    }
    auto lnks = toml::find_or(doc, "links", uVal);
    if (!lnks.is_empty()) {
        auto& connArray = lnks.as_array();
        for (const auto& conn : connArray) {
            if (conn.is_array()) {
                auto& connAct = conn.as_array();
                brk->linkEndpoints(connAct[0].as_string(), connAct[1].as_string());
            } else {
                std::string pub = getOrDefault(conn, "publication", std::string());
                if (!pub.empty()) {
                    addTargets(conn, "targets", [brk, &pub](const std::string& target) {
                        brk->dataLink(pub, target);
                    });
                } else {
                    std::string ipt = getOrDefault(conn, "input", std::string());
                    if (!ipt.empty()) {
                        addTargets(conn, "targets", [brk, &ipt](const std::string& target) {
                            brk->dataLink(target, ipt);
                        });
                        addTargets(conn, "sources", [brk, &ipt](const std::string& source) {
                            brk->dataLink(source, ipt);
                        });
                    } else {
                        std::string ept = getOrDefault(conn, "endpoint", std::string());
                        if (!ept.empty()) {
                            addTargets(conn, "targets", [brk, &ept](const std::string& target) {
                                brk->linkEndpoints(ept, target);
                            });
                            addTargets(conn, "sources", [brk, &ept](const std::string& source) {
                                brk->linkEndpoints(source, ept);
                            });
                        }
                    }
                }
            }
        }
    }
    auto filts = toml::find_or(doc, "filters", uVal);
    if (!filts.is_empty()) {
        auto& filtArray = filts.as_array();
        for (const auto& filt : filtArray) {
            if (filt.is_array()) {
                auto& filtAct = filt.as_array();
                brk->addSourceFilterToEndpoint(filtAct[0].as_string(), filtAct[1].as_string());
            } else {
                std::string fname = getOrDefault(filt, "filter", std::string());
                if (!fname.empty()) {
                    auto asrc = [brk, &fname](const std::string& ept) {
                        brk->addSourceFilterToEndpoint(fname, ept);
                    };
                    addTargets(filt, "endpoints", asrc);
                    addTargets(filt, "source_endpoints", asrc);
                    addTargets(filt, "sourceEndpoints", asrc);
                    auto adst = [brk, &fname](const std::string& ept) {
                        brk->addDestinationFilterToEndpoint(fname, ept);
                    };
                    addTargets(filt, "dest_endpoints", adst);
                    addTargets(filt, "destEndpoints", adst);
                }
            }
        }
    }
    auto globals = toml::find_or(doc, "globals", uVal);
    if (!globals.is_empty()) {
        if (globals.is_array()) {
            for (auto& val : globals.as_array()) {
                brk->setGlobal(val.as_array()[0].as_string(), val.as_array()[1].as_string());
            }
        } else {
            for (const auto& val : globals.as_table()) {
                brk->setGlobal(val.first, val.second.as_string());
            }
        }
    }
    auto aliases = toml::find_or(doc, "aliases", uVal);
    if (!aliases.is_empty()) {
        if (aliases.is_array()) {
            for (auto& val : aliases.as_array()) {
                brk->addAlias(val.as_array()[0].as_string(), val.as_array()[1].as_string());
            }
        } else {
            for (const auto& val : aliases.as_table()) {
                brk->addAlias(val.first, val.second.as_string());
            }
        }
    }
}